

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

void wenc14(uint16_t a,uint16_t b,uint16_t *l,uint16_t *h)

{
  int16_t ds;
  int16_t ms;
  int16_t bs;
  int16_t as;
  uint16_t *h_local;
  uint16_t *l_local;
  uint16_t b_local;
  uint16_t a_local;
  
  *l = (uint16_t)((int)(short)a + (int)(short)b >> 1);
  *h = a - b;
  return;
}

Assistant:

static inline void
wenc14 (uint16_t a, uint16_t b, uint16_t* l, uint16_t* h)
{
    int16_t as = (int16_t) a;
    int16_t bs = (int16_t) b;

    int16_t ms = (as + bs) >> 1;
    int16_t ds = as - bs;

    *l = (uint16_t) ms;
    *h = (uint16_t) ds;
}